

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddImageQuad
          (ImDrawList *this,ImTextureID user_texture_id,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,
          ImVec2 *uv1,ImVec2 *uv2,ImVec2 *uv3,ImVec2 *uv4,ImU32 col)

{
  uint uVar1;
  
  if (col < 0x1000000) {
    return;
  }
  uVar1 = (this->_TextureIdStack).Size;
  if ((ulong)uVar1 != 0) {
    if ((int)uVar1 < 1) {
      __assert_fail("Size > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.h"
                    ,0x4f0,"T &ImVector<void *>::back() [T = void *]");
    }
    if ((this->_TextureIdStack).Data[(ulong)uVar1 - 1] == user_texture_id) {
      PrimReserve(this,6,4);
      PrimQuadUV(this,p1,p2,p3,p4,uv1,uv2,uv3,uv4,col);
      return;
    }
  }
  PushTextureID(this,user_texture_id);
  PrimReserve(this,6,4);
  PrimQuadUV(this,p1,p2,p3,p4,uv1,uv2,uv3,uv4,col);
  PopTextureID(this);
  return;
}

Assistant:

void ImDrawList::AddImageQuad(ImTextureID user_texture_id, const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, const ImVec2& uv1, const ImVec2& uv2, const ImVec2& uv3, const ImVec2& uv4, ImU32 col)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    const bool push_texture_id = _TextureIdStack.empty() || user_texture_id != _TextureIdStack.back();
    if (push_texture_id)
        PushTextureID(user_texture_id);

    PrimReserve(6, 4);
    PrimQuadUV(p1, p2, p3, p4, uv1, uv2, uv3, uv4, col);

    if (push_texture_id)
        PopTextureID();
}